

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O2

REF_STATUS ref_inflate_compact_rail(REF_INT *n,REF_DBL *x,REF_DBL *yz,REF_DBL *phi)

{
  int iVar1;
  REF_DBL RVar2;
  REF_DBL *pRVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  iVar1 = *n;
  if ((long)iVar1 != 0) {
    pRVar3 = yz + 2;
    uVar5 = 0;
    for (uVar4 = 1; (long)uVar4 < (long)iVar1; uVar4 = uVar4 + 1) {
      uVar6 = (uint)(1e-08 < x[uVar4] - x[uVar5]) + (int)uVar5;
      uVar5 = (ulong)uVar6;
      if (uVar4 != uVar5) {
        x[uVar5] = x[uVar4];
        RVar2 = pRVar3[1];
        yz[uVar6 * 2] = *pRVar3;
        (yz + uVar6 * 2)[1] = RVar2;
        phi[uVar5] = phi[uVar4];
      }
      pRVar3 = pRVar3 + 2;
    }
    *n = (int)uVar5 + 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_compact_rail(REF_INT *n, REF_DBL *x, REF_DBL *yz,
                                            REF_DBL *phi) {
  REF_INT orig, compact, max;
  REF_DBL tol = 1e-8;
  if (0 == *n) return REF_SUCCESS;

  max = *n;
  compact = 0;

  for (orig = 1; orig < max; orig++) {
    if (ABS(x[orig] - x[compact] > tol)) {
      compact++;
    }
    if (orig != compact) {
      x[compact] = x[orig];
      yz[0 + 2 * compact] = yz[0 + 2 * orig];
      yz[1 + 2 * compact] = yz[1 + 2 * orig];
      phi[compact] = phi[orig];
    }
  }
  *n = compact + 1;

  return REF_SUCCESS;
}